

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core-test.cc
# Opt level: O0

void __thiscall ArgTest_FormatArgs_Test::TestBody(ArgTest_FormatArgs_Test *this)

{
  undefined1 uVar1;
  AssertionResult gtest_ar_;
  format_args args;
  AssertionResult *this_00;
  undefined7 in_stack_ffffffffffffff70;
  string local_88 [4];
  int in_stack_ffffffffffffff7c;
  char *in_stack_ffffffffffffff80;
  Type in_stack_ffffffffffffff8c;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  *in_stack_ffffffffffffff90;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffffc0;
  char *in_stack_ffffffffffffffc8;
  char *in_stack_ffffffffffffffd0;
  AssertionResult *in_stack_ffffffffffffffd8;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffffe0;
  undefined1 local_18 [24];
  
  uVar1 = (undefined1)((ulong)local_18 >> 0x38);
  fmt::v5::format_args::format_args<>((format_args *)0x120da0);
  this_00 = (AssertionResult *)&stack0xffffffffffffffb8;
  fmt::v5::
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  ::get(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
  fmt::v5::basic_format_arg::operator_cast_to_bool((basic_format_arg *)this_00);
  testing::AssertionResult::AssertionResult(this_00,(bool)uVar1);
  uVar1 = testing::AssertionResult::operator_cast_to_bool
                    ((AssertionResult *)&stack0xffffffffffffffd8);
  if (!(bool)uVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffff90);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,
               (char *)in_stack_ffffffffffffffc0.ptr_);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c,
               in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,
               (char *)CONCAT17(uVar1,in_stack_ffffffffffffff70));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_ffffffffffffffe0.ptr_,(Message *)in_stack_ffffffffffffffd8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_00);
    std::__cxx11::string::~string(local_88);
    testing::Message::~Message((Message *)0x120e99);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x120ef6);
  return;
}

Assistant:

TEST(ArgTest, FormatArgs) {
  fmt::format_args args;
  EXPECT_FALSE(args.get(1));
}